

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
libcellml::Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode(GeneratorImpl *this)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  byte local_124;
  byte local_121;
  string local_110;
  string local_f0;
  string local_d0;
  byte local_a9;
  string local_a8;
  string local_88;
  byte local_61;
  string local_60;
  string local_30 [8];
  string interfaceVoiStateAndVariableInfoCode;
  GeneratorImpl *this_local;
  
  interfaceVoiStateAndVariableInfoCode.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  local_61 = 0;
  bVar1 = modelHasOdes(this);
  local_121 = 0;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::interfaceVoiInfoString_abi_cxx11_(&local_60,peVar3);
    local_61 = 1;
    local_121 = std::__cxx11::string::empty();
    local_121 = local_121 ^ 0xff;
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_121 & 1) != 0) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::interfaceVoiInfoString_abi_cxx11_(&local_88,peVar3);
    std::__cxx11::string::operator+=(local_30,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_a9 = 0;
  bVar1 = modelHasOdes(this);
  local_124 = 0;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::interfaceStateInfoString_abi_cxx11_(&local_a8,peVar3);
    local_a9 = 1;
    local_124 = std::__cxx11::string::empty();
    local_124 = local_124 ^ 0xff;
  }
  if ((local_a9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_124 & 1) != 0) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::interfaceStateInfoString_abi_cxx11_(&local_d0,peVar3);
    std::__cxx11::string::operator+=(local_30,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mProfile);
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_(&local_f0,peVar3);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_f0);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::interfaceVariableInfoString_abi_cxx11_(&local_110,peVar3);
    std::__cxx11::string::operator+=(local_30,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->mCode,"\n");
  }
  std::__cxx11::string::operator+=((string *)&this->mCode,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode()
{
    std::string interfaceVoiStateAndVariableInfoCode;

    if (modelHasOdes()
        && !mProfile->interfaceVoiInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVoiInfoString();
    }

    if (modelHasOdes()
        && !mProfile->interfaceStateInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceStateInfoString();
    }

    if (!mProfile->interfaceVariableInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVariableInfoString();
    }

    if (!interfaceVoiStateAndVariableInfoCode.empty()) {
        mCode += "\n";
    }

    mCode += interfaceVoiStateAndVariableInfoCode;
}